

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O1

int Ssw_SmlObjsAreEqualWord(Ssw_Sml_t *p,Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar1 = p->nWordsTotal;
  iVar2 = p->nWordsPref;
  if (iVar2 < iVar1) {
    lVar3 = 0;
    do {
      if (*(int *)((long)&p[1].pAig + lVar3 * 4 + (long)(pObj0->Id * iVar1) * 4 + (long)iVar2 * 4)
          != *(int *)((long)&p[1].pAig + lVar3 * 4 + (long)(pObj1->Id * iVar1) * 4 + (long)iVar2 * 4
                     )) {
        return 0;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 - iVar2 != (int)lVar3);
  }
  return 1;
}

Assistant:

int Ssw_SmlObjsAreEqualWord( Ssw_Sml_t * p, Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    unsigned * pSims0, * pSims1;
    int i;
    pSims0 = Ssw_ObjSim(p, pObj0->Id);
    pSims1 = Ssw_ObjSim(p, pObj1->Id);
    for ( i = p->nWordsPref; i < p->nWordsTotal; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}